

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_section.hpp
# Opt level: O2

void pstore::repo::bss_section_creation_dispatcher::validate
               (not_null<const_pstore::repo::section_content_*> sec)

{
  if ((((sec.ptr_)->ifixups).
       super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       ((sec.ptr_)->ifixups).
       super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((sec.ptr_)->xfixups).
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      ((sec.ptr_)->xfixups).
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    if (*(int *)((long)&((sec.ptr_)->data).elements_ + 4) == 0) {
      return;
    }
    raise<pstore::repo::error_code>(bss_section_too_large);
  }
  assert_failed("sec->ifixups.empty () && sec->xfixups.empty ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/bss_section.hpp"
                ,0x87);
}

Assistant:

static void validate (gsl::not_null<section_content const *> const sec) {
                PSTORE_ASSERT (sec->ifixups.empty () && sec->xfixups.empty ());
                if (sec->data.size () > std::numeric_limits<bss_section::size_type>::max ()) {
                    raise (error_code::bss_section_too_large);
                }
            }